

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResult.cpp
# Opt level: O1

void __thiscall xe::TestCaseResultData::clear(TestCaseResultData *this)

{
  pointer puVar1;
  
  this->m_statusCode = TESTSTATUSCODE_LAST;
  (this->m_statusDetails)._M_string_length = 0;
  *(this->m_statusDetails)._M_dataplus._M_p = '\0';
  (this->m_casePath)._M_string_length = 0;
  *(this->m_casePath)._M_dataplus._M_p = '\0';
  puVar1 = (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  return;
}

Assistant:

void TestCaseResultData::clear (void)
{
	m_statusCode = TESTSTATUSCODE_LAST;
	m_statusDetails.clear();
	m_casePath.clear();
	m_data.clear();
}